

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

uint * Cec_ManSimSimRef(Cec_ManSim_t *p,int i)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  size_t __size;
  
  if (p->pSimInfo[i] != 0) {
    __assert_fail("p->pSimInfo[i] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                  ,0x197,"unsigned int *Cec_ManSimSimRef(Cec_ManSim_t *, int)");
  }
  if (p->MemFree == 0) {
    if (p->nWordsAlloc == 0) {
      if (p->pMems != (uint *)0x0) {
        __assert_fail("p->pMems == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                      ,0x19c,"unsigned int *Cec_ManSimSimRef(Cec_ManSim_t *, int)");
      }
      p->nWordsAlloc = 0x20000;
      p->nMems = 1;
    }
    iVar1 = p->nWordsAlloc;
    p->nWordsAlloc = iVar1 * 2;
    __size = (long)iVar1 << 3;
    if (p->pMems == (uint *)0x0) {
      puVar3 = (uint *)malloc(__size);
    }
    else {
      puVar3 = (uint *)realloc(p->pMems,__size);
    }
    p->pMems = puVar3;
    Cec_ManSimMemRelink(p);
  }
  p->pSimInfo[i] = p->MemFree;
  iVar1 = p->MemFree;
  p->MemFree = p->pMems[iVar1];
  if ((-1 < i) && (i < p->pAig->nObjs)) {
    puVar3 = p->pMems + iVar1;
    *puVar3 = p->pAig->pObjs[(uint)i].Value;
    iVar2 = p->nMems;
    iVar1 = iVar2 + 1;
    p->nMems = iVar1;
    if (p->nMemsMax <= iVar2) {
      p->nMemsMax = iVar1;
    }
    return puVar3;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

unsigned * Cec_ManSimSimRef( Cec_ManSim_t * p, int i )
{
    unsigned * pSim;
    assert( p->pSimInfo[i] == 0 );
    if ( p->MemFree == 0 )
    {
        if ( p->nWordsAlloc == 0 )
        {
            assert( p->pMems == NULL );
            p->nWordsAlloc = (1<<17); // -> 1Mb
            p->nMems = 1;
        }
        p->nWordsAlloc *= 2;
        p->pMems = ABC_REALLOC( unsigned, p->pMems, p->nWordsAlloc );
        Cec_ManSimMemRelink( p );
    }
    p->pSimInfo[i] = p->MemFree;
    pSim = p->pMems + p->MemFree;
    p->MemFree = pSim[0];
    pSim[0] = Gia_ObjValue( Gia_ManObj(p->pAig, i) );
    p->nMems++;
    if ( p->nMemsMax < p->nMems )
        p->nMemsMax = p->nMems;
    return pSim;
}